

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

void ucnv_extGetUnicodeSetString
               (UConverterSharedData *sharedData,int32_t *cx,USetAdder *sa,
               UConverterUnicodeSet which,int32_t minLength,UChar32 firstCP,UChar *s,int32_t length,
               int32_t sectionIndex,UErrorCode *pErrorCode)

{
  ushort uVar1;
  uint value_00;
  UBool UVar2;
  ushort *puVar3;
  uint32_t *puVar4;
  int iVar5;
  int local_50;
  int32_t count;
  int32_t i;
  uint32_t value;
  uint32_t *fromUSectionValues;
  UChar *fromUSectionUChars;
  UChar32 firstCP_local;
  int32_t minLength_local;
  UConverterUnicodeSet which_local;
  USetAdder *sa_local;
  int32_t *cx_local;
  UConverterSharedData *sharedData_local;
  
  puVar3 = (ushort *)((long)cx + (long)sectionIndex * 2 + (long)cx[5]);
  puVar4 = (uint32_t *)((long)cx + (long)sectionIndex * 4 + (long)cx[6]);
  uVar1 = *puVar3;
  UVar2 = extSetUseMapping(which,minLength,*puVar4);
  if (UVar2 != '\0') {
    iVar5 = 2;
    if ((uint)firstCP < 0x10000) {
      iVar5 = 1;
    }
    if (length == iVar5) {
      (*(code *)sa->add)(sa->set,firstCP);
    }
    else {
      (*sa->addString)(sa->set,s,length);
    }
  }
  for (local_50 = 0; local_50 < (int)(uint)uVar1; local_50 = local_50 + 1) {
    s[length] = puVar3[(long)local_50 + 1];
    value_00 = puVar4[(long)local_50 + 1];
    if (value_00 != 0) {
      if (value_00 >> 0x18 == 0) {
        ucnv_extGetUnicodeSetString
                  (sharedData,cx,sa,which,minLength,firstCP,s,length + 1,value_00,pErrorCode);
      }
      else {
        UVar2 = extSetUseMapping(which,minLength,value_00);
        if (UVar2 != '\0') {
          (*sa->addString)(sa->set,s,length + 1);
        }
      }
    }
  }
  return;
}

Assistant:

static void
ucnv_extGetUnicodeSetString(const UConverterSharedData *sharedData,
                            const int32_t *cx,
                            const USetAdder *sa,
                            UConverterUnicodeSet which,
                            int32_t minLength,
                            UChar32 firstCP,
                            UChar s[UCNV_EXT_MAX_UCHARS], int32_t length,
                            int32_t sectionIndex,
                            UErrorCode *pErrorCode) {
    const UChar *fromUSectionUChars;
    const uint32_t *fromUSectionValues;

    uint32_t value;
    int32_t i, count;

    fromUSectionUChars=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_UCHARS_INDEX, UChar)+sectionIndex;
    fromUSectionValues=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_VALUES_INDEX, uint32_t)+sectionIndex;

    /* read first pair of the section */
    count=*fromUSectionUChars++;
    value=*fromUSectionValues++;

    if(extSetUseMapping(which, minLength, value)) {
        if(length==U16_LENGTH(firstCP)) {
            /* add the initial code point */
            sa->add(sa->set, firstCP);
        } else {
            /* add the string so far */
            sa->addString(sa->set, s, length);
        }
    }

    for(i=0; i<count; ++i) {
        /* append this code unit and recurse or add the string */
        s[length]=fromUSectionUChars[i];
        value=fromUSectionValues[i];

        if(value==0) {
            /* no mapping, do nothing */
        } else if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
            ucnv_extGetUnicodeSetString(
                sharedData, cx, sa, which, minLength,
                firstCP, s, length+1,
                (int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value),
                pErrorCode);
        } else if(extSetUseMapping(which, minLength, value)) {
            sa->addString(sa->set, s, length+1);
        }
    }
}